

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decompression.cpp
# Opt level: O2

ChunkHeader * __thiscall
Compressor::encodeChunk
          (ChunkHeader *__return_storage_ptr__,Compressor *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *output,Image *input,MaskRect bounds
          ,Point location,bool isSwitch)

{
  pointer pCVar1;
  uint8_t *puVar2;
  Impl *pIVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar4;
  ulong uVar5;
  pointer puVar6;
  pointer pCVar7;
  pointer puVar8;
  long lVar9;
  long lVar10;
  byte bVar11;
  undefined1 auVar12 [16];
  int p2;
  int p1;
  MaskRect bounds_local;
  Image sized;
  
  bounds_local = bounds;
  Image::resizeClampToEdge
            (&sized,input,
             (Size)((ulong)((input->size).width + 3U & 0xfffffffc) |
                   (ulong)input->size & 0xffffffff00000000));
  if (!isSwitch) {
    swapBR(&sized);
  }
  __return_storage_ptr__->type = TYPE_COLOR1;
  (__return_storage_ptr__->masks).super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->masks).super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->masks).super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->transparentMasks).super__Vector_base<MaskRect,_std::allocator<MaskRect>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->transparentMasks).super__Vector_base<MaskRect,_std::allocator<MaskRect>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->transparentMasks).super__Vector_base<MaskRect,_std::allocator<MaskRect>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->alignmentWords = 0;
  __return_storage_ptr__->x = 0;
  __return_storage_ptr__->y = 0;
  __return_storage_ptr__->w = 0;
  __return_storage_ptr__->x = (uint16_t)location.x;
  __return_storage_ptr__->y = (uint16_t)location.y;
  auVar12._8_8_ = 0;
  auVar12._0_4_ = (input->size).width;
  auVar12._4_4_ = (input->size).height;
  auVar12 = pshuflw(auVar12,auVar12,0xe8);
  __return_storage_ptr__->w = (short)auVar12._0_4_;
  __return_storage_ptr__->h = (short)((uint)auVar12._0_4_ >> 0x10);
  __return_storage_ptr__->size = 0;
  pCVar7 = (input->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar1 = (input->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar9 = (long)pCVar1 - (long)pCVar7;
  for (lVar10 = lVar9 >> 4; 0 < lVar10; lVar10 = lVar10 + -1) {
    if ((uint)*pCVar7 < 0xff000000) goto LAB_00106b19;
    if ((uint)pCVar7[1] < 0xff000000) {
      pCVar7 = pCVar7 + 1;
      goto LAB_00106b19;
    }
    if ((uint)pCVar7[2] < 0xff000000) {
      pCVar7 = pCVar7 + 2;
      goto LAB_00106b19;
    }
    if ((uint)pCVar7[3] < 0xff000000) {
      pCVar7 = pCVar7 + 3;
      goto LAB_00106b19;
    }
    pCVar7 = pCVar7 + 4;
    lVar9 = lVar9 + -0x10;
  }
  lVar9 = lVar9 >> 2;
  if (lVar9 == 1) {
LAB_00106afd:
    if (0xfeffffff < (uint)*pCVar7) {
      pCVar7 = pCVar1;
    }
LAB_00106b19:
    if (pCVar7 != pCVar1) {
      std::vector<MaskRect,_std::allocator<MaskRect>_>::push_back
                (&__return_storage_ptr__->transparentMasks,&bounds_local);
      bVar11 = 0;
      goto LAB_00106b3d;
    }
  }
  else {
    if (lVar9 == 2) {
LAB_00106af1:
      if (0xfeffffff < (uint)*pCVar7) {
        pCVar7 = pCVar7 + 1;
        goto LAB_00106afd;
      }
      goto LAB_00106b19;
    }
    if (lVar9 == 3) {
      if (0xfeffffff < (uint)*pCVar7) {
        pCVar7 = pCVar7 + 1;
        goto LAB_00106af1;
      }
      goto LAB_00106b19;
    }
  }
  bVar11 = 1;
  std::vector<MaskRect,_std::allocator<MaskRect>_>::push_back
            (&__return_storage_ptr__->masks,&bounds_local);
LAB_00106b3d:
  Impl::getPalettes(this->impl,&sized,&p1,&p2);
  if (-1 < p1) {
    pvVar4 = Impl::writePaletted(this->impl,&sized,&this->impl->palette1,false);
    puVar2 = (pvVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    compress(this,output,puVar2,
             *(int *)&(pvVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (int)puVar2,isSwitch);
    uVar5 = (long)(output->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(output->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(pvVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(pvVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start) < uVar5) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(output,pvVar4);
    }
    else {
      __return_storage_ptr__->size = (uint32_t)uVar5;
    }
    __return_storage_ptr__->type = TYPE_INDEXED;
  }
  if ((bool)(~bVar11 & -1 < p2)) {
    pvVar4 = Impl::writePaletted(this->impl,&sized,&this->impl->palette2,true);
    puVar2 = (pvVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    compress(this,&this->impl->scratch,puVar2,
             *(int *)&(pvVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (int)puVar2,isSwitch);
    puVar6 = (output->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar8 = (output->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    pIVar3 = this->impl;
    if ((puVar6 == puVar8) ||
       ((ulong)((long)(pIVar3->scratch).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(pIVar3->scratch).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start) < (ulong)((long)puVar8 - (long)puVar6))) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(output,&pIVar3->scratch)
      ;
      puVar6 = (output->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar8 = (output->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      __return_storage_ptr__->size = (int)puVar8 - (int)puVar6;
      __return_storage_ptr__->type = TYPE_INDEXED_ALPHA;
    }
  }
  else {
    puVar6 = (output->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar8 = (output->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  }
  if (puVar6 == puVar8) {
    prepareWriteRGB(&this->impl->scratch,&sized);
    puVar2 = (this->impl->scratch).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
    compress(this,output,puVar2,
             *(int *)&(this->impl->scratch).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (int)puVar2,isSwitch);
    __return_storage_ptr__->size =
         *(int *)&(output->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_finish -
         *(int *)&(output->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start;
    __return_storage_ptr__->type = TYPE_COLOR;
  }
  std::_Vector_base<Color,_std::allocator<Color>_>::~_Vector_base
            (&sized.colorData.super__Vector_base<Color,_std::allocator<Color>_>);
  return __return_storage_ptr__;
}

Assistant:

ChunkHeader Compressor::encodeChunk(std::vector<uint8_t>& output, const Image& input, MaskRect bounds, Point location, bool isSwitch) {
	Image sized = input.resizeClampToEdge(align(input.size));
	if (!isSwitch) {
		swapBR(sized);
	}
	ChunkHeader header = {};
	header.x = location.x;
	header.y = location.y;
	header.w = input.size.width;
	header.h = input.size.height;
	header.size = 0;
	bool hasTransparent = std::any_of(input.colorData.begin(), input.colorData.end(), [](Color c){ return c.a != 255; });
	if (hasTransparent) {
		header.transparentMasks.push_back(bounds);
	} else {
		header.masks.push_back(bounds);
	}
	int p1, p2;
	impl->getPalettes(sized, p1, p2);
	if (p1 >= 0) {
		auto& img = impl->writePaletted(sized, impl->palette1, false);
		compress(output, img.data(), static_cast<int>(img.size()), isSwitch);
		if (img.size() < output.size()) {
			output = img;
		} else {
			header.size = output.size();
		}
		header.type = ChunkHeader::TYPE_INDEXED;
	}
	if (p2 >= 0 && hasTransparent) {
		auto& img = impl->writePaletted(sized, impl->palette2, true);
		compress(impl->scratch, img.data(), static_cast<int>(img.size()), isSwitch);
		if (output.empty() || output.size() > impl->scratch.size()) {
			output = impl->scratch;
			header.size = output.size();
			header.type = ChunkHeader::TYPE_INDEXED_ALPHA;
		}
	}

	if (output.empty()) {
		prepareWriteRGB(impl->scratch, sized);
		compress(output, impl->scratch.data(), impl->scratch.size(), isSwitch);
		header.size = output.size();
		header.type = ChunkHeader::TYPE_COLOR;
	}

	return header;
}